

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void introsort_loop(int *a,int n,int lim)

{
  int iVar1;
  int local_18;
  int p;
  int lim_local;
  int n_local;
  int *a_local;
  
  local_18 = lim;
  p = n;
  while( true ) {
    if (p < 0x11) {
      return;
    }
    if (local_18 == 0) break;
    local_18 = local_18 + -1;
    iVar1 = median(*a,a[p / 2],a[p + -1]);
    iVar1 = partition(a,p,iVar1);
    introsort_loop(a + iVar1,p - iVar1,local_18);
    p = iVar1;
  }
  heap_sort(a,p);
  return;
}

Assistant:

static void
introsort_loop(int *a, int n, int lim)
{
    int p;
    while (n > 16) {
        if (lim == 0) {
            heap_sort(a, n);
            return;
        }
        --lim;
        p = partition(a, n, median(a[0], a[n/2], a[n-1]));
        introsort_loop(a + p, n - p, lim);
        n = p;
    }
}